

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall
Assimp::ValidateDSProcess::SearchForInvalidTextures
          (ValidateDSProcess *this,aiMaterial *pMaterial,aiTextureType type)

{
  char *pcVar1;
  aiMaterialProperty *paVar2;
  aiMesh *paVar3;
  uint uVar4;
  aiScene *paVar5;
  int iVar6;
  undefined8 extraout_RAX;
  aiScene *paVar7;
  aiMaterial *paVar8;
  ulong uVar9;
  ValidateDSProcess *pVVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> mappings;
  uint local_80;
  allocator_type local_79;
  aiMaterialProperty **local_78;
  aiTextureType local_6c;
  char *local_68;
  char *local_60;
  aiMaterial *local_58;
  ValidateDSProcess local_50;
  
  pVVar10 = (ValidateDSProcess *)(ulong)type;
  local_6c = type;
  local_50.mScene = (aiScene *)this;
  local_60 = TextureTypeToString(type);
  uVar13 = pMaterial->mNumProperties;
  local_58 = pMaterial;
  if (uVar13 == 0) {
    local_80 = 0;
    uVar14 = 0xffffffff;
  }
  else {
    local_78 = pMaterial->mProperties;
    uVar15 = 0xffffffff;
    lVar11 = 0;
    local_80 = 0;
    do {
      paVar2 = local_78[lVar11];
      if (paVar2 == (aiMaterialProperty *)0x0) {
        __assert_fail("nullptr != prop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                      ,0x250,
                      "void Assimp::ValidateDSProcess::SearchForInvalidTextures(const aiMaterial *, aiTextureType)"
                     );
      }
      pcVar1 = (paVar2->mKey).data;
      pVVar10 = (ValidateDSProcess *)pcVar1;
      iVar6 = strcmp(pcVar1,"$tex.file");
      if ((iVar6 == 0) && (paVar2->mSemantic == local_6c)) {
        uVar4 = paVar2->mIndex;
        if ((int)paVar2->mIndex < (int)uVar15) {
          uVar4 = uVar15;
        }
        if (paVar2->mType != aiPTI_String) {
          ReportError(pVVar10,"Material property %s is expected to be a string",pcVar1);
        }
        local_80 = local_80 + 1;
        uVar15 = uVar4;
      }
      uVar14 = (ulong)uVar15;
      lVar11 = lVar11 + 1;
    } while (uVar13 != (uint)lVar11);
  }
  paVar5 = local_50.mScene;
  paVar8 = local_58;
  uVar13 = (uint)uVar14;
  if (uVar13 + 1 != local_80) {
    ReportError(pVVar10,"%s #%i is set, but there are only %i %s textures",local_60,uVar14,
                (ulong)local_80,local_60);
  }
  if (local_80 != 0) {
    pVVar10 = &local_50;
    std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::vector
              ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)pVVar10,
               (long)(int)local_80,&local_79);
    if (paVar8->mNumProperties == 0) {
      uVar14 = 1;
    }
    else {
      local_78 = (aiMaterialProperty **)
                 CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
      local_68 = "Material property %s%i is expected to be an integer (size is %i)";
      uVar9 = 0;
      do {
        paVar2 = paVar8->mProperties[uVar9];
        if (paVar2->mSemantic == local_6c) {
          uVar13 = paVar2->mIndex;
          if ((int)local_80 <= (int)uVar13) {
            ReportError(pVVar10,
                        "Found texture property with index %i, although there are only %i textures of type %s"
                        ,(ulong)uVar13,(ulong)local_80,local_60);
          }
          pcVar1 = (paVar2->mKey).data;
          pVVar10 = (ValidateDSProcess *)pcVar1;
          iVar6 = strcmp(pcVar1,"$tex.mapping");
          if (iVar6 == 0) {
            if ((paVar2->mType != aiPTI_Integer) || (paVar2->mDataLength < 4)) {
LAB_0030981d:
              ReportError(pVVar10,local_68,pcVar1,(ulong)uVar13,(ulong)paVar2->mDataLength);
            }
            *(int *)((long)local_50.super_BaseProcess._vptr_BaseProcess + (ulong)uVar13 * 4) =
                 *(int *)paVar2->mData;
          }
          else {
            pVVar10 = (ValidateDSProcess *)pcVar1;
            iVar6 = strcmp(pcVar1,"$tex.uvtrafo");
            if (iVar6 == 0) {
              if ((paVar2->mType != aiPTI_Float) || (paVar2->mDataLength < 0x14)) {
                local_68 = "Material property %s%i is expected to be 5 floats large (size is %i)";
                goto LAB_0030981d;
              }
            }
            else {
              pVVar10 = (ValidateDSProcess *)pcVar1;
              iVar6 = strcmp(pcVar1,"$tex.uvwsrc");
              if (iVar6 == 0) {
                if ((paVar2->mType != aiPTI_Integer) || (paVar2->mDataLength < 4))
                goto LAB_0030981d;
                uVar13 = *(uint *)paVar2->mData;
                uVar14 = (ulong)uVar13;
                paVar7 = (aiScene *)paVar5->mMeshes;
                if (paVar7->mNumMeshes != 0) {
                  uVar12 = 0;
                  do {
                    paVar3 = paVar7->mMeshes[uVar12];
                    if (uVar9 == paVar3->mMaterialIndex) {
                      lVar11 = 0;
                      do {
                        if ((paVar3->mTextureCoords[lVar11] == (aiVector3D *)0x0) ||
                           (paVar3->mNumVertices == 0)) goto LAB_003096b7;
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != 8);
                      lVar11 = 8;
LAB_003096b7:
                      if ((int)lVar11 <= (int)uVar13) {
                        ReportWarning(pVVar10,
                                      "Invalid UV index: %i (key %s). Mesh %i has only %i UV channels"
                                      ,(ulong)uVar13,pcVar1,uVar12 & 0xffffffff);
                      }
                    }
                    uVar12 = uVar12 + 1;
                    paVar7 = (aiScene *)paVar5->mMeshes;
                  } while (uVar12 < paVar7->mNumMeshes);
                }
                local_78 = (aiMaterialProperty **)((ulong)local_78 & 0xffffffff00000000);
              }
            }
          }
        }
        uVar13 = (uint)uVar14;
        uVar9 = uVar9 + 1;
        paVar8 = local_58;
      } while (uVar9 < local_58->mNumProperties);
      uVar14 = (ulong)local_78 & 0xffffffff;
    }
    if (((uVar14 & 1) != 0) && (paVar7 = (aiScene *)paVar5->mMeshes, paVar7->mNumMeshes != 0)) {
      uVar14 = 0;
      do {
        if (((paVar7->mMeshes[uVar14]->mMaterialIndex == uVar13) &&
            (*(int *)local_50.super_BaseProcess._vptr_BaseProcess == 0)) &&
           (paVar7->mMeshes[uVar14]->mTextureCoords[0] == (aiVector3D *)0x0)) {
          ReportWarning(pVVar10,"UV-mapped texture, but there are no UV coords");
        }
        uVar14 = uVar14 + 1;
        paVar7 = (aiScene *)paVar5->mMeshes;
      } while (uVar14 < paVar7->mNumMeshes);
    }
    if (local_50.super_BaseProcess._vptr_BaseProcess != (_func_int **)0x0) {
      operator_delete(local_50.super_BaseProcess._vptr_BaseProcess,
                      (long)local_50.super_BaseProcess.progress -
                      (long)local_50.super_BaseProcess._vptr_BaseProcess);
    }
  }
  return;
}

Assistant:

void ValidateDSProcess::SearchForInvalidTextures(const aiMaterial* pMaterial,
    aiTextureType type)
{
    const char* szType = TextureTypeToString(type);

    // ****************************************************************************
    // Search all keys of the material ...
    // textures must be specified with ascending indices
    // (e.g. diffuse #2 may not be specified if diffuse #1 is not there ...)
    // ****************************************************************************

    int iNumIndices = 0;
    int iIndex = -1;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i) {
        aiMaterialProperty* prop = pMaterial->mProperties[ i ];
        ai_assert(nullptr != prop);
        if ( !::strcmp(prop->mKey.data,"$tex.file") && prop->mSemantic == static_cast<unsigned int>(type))  {
            iIndex = std::max(iIndex, (int) prop->mIndex);
            ++iNumIndices;

            if (aiPTI_String != prop->mType) {
                ReportError("Material property %s is expected to be a string", prop->mKey.data);
            }
        }
    }
    if (iIndex +1 != iNumIndices)   {
        ReportError("%s #%i is set, but there are only %i %s textures",
            szType,iIndex,iNumIndices,szType);
    }
	if (!iNumIndices) {
		return;
	}
    std::vector<aiTextureMapping> mappings(iNumIndices);

    // Now check whether all UV indices are valid ...
    bool bNoSpecified = true;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i) {
        aiMaterialProperty* prop = pMaterial->mProperties[i];
		if (prop->mSemantic != type) {
			continue;
		}

        if ((int)prop->mIndex >= iNumIndices)
        {
            ReportError("Found texture property with index %i, although there "
                "are only %i textures of type %s",
                prop->mIndex, iNumIndices, szType);
        }

        if (!::strcmp(prop->mKey.data,"$tex.mapping"))  {
            if (aiPTI_Integer != prop->mType || prop->mDataLength < sizeof(aiTextureMapping))
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            mappings[prop->mIndex] = *((aiTextureMapping*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvtrafo")) {
            if (aiPTI_Float != prop->mType || prop->mDataLength < sizeof(aiUVTransform))
            {
                ReportError("Material property %s%i is expected to be 5 floats large (size is %i)",
                    prop->mKey.data,prop->mIndex, prop->mDataLength);
            }
			//mappings[prop->mIndex] = ((aiUVTransform*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvwsrc")) {
            if (aiPTI_Integer != prop->mType || sizeof(int) > prop->mDataLength)
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            bNoSpecified = false;

            // Ignore UV indices for texture channels that are not there ...

            // Get the value
            iIndex = *((unsigned int*)prop->mData);

            // Check whether there is a mesh using this material
            // which has not enough UV channels ...
            for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
            {
                aiMesh* mesh = this->mScene->mMeshes[a];
                if(mesh->mMaterialIndex == (unsigned int)i)
                {
                    int iChannels = 0;
                    while (mesh->HasTextureCoords(iChannels))++iChannels;
                    if (iIndex >= iChannels)
                    {
                        ReportWarning("Invalid UV index: %i (key %s). Mesh %i has only %i UV channels",
                            iIndex,prop->mKey.data,a,iChannels);
                    }
                }
            }
        }
    }
    if (bNoSpecified)
    {
        // Assume that all textures are using the first UV channel
        for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
        {
            aiMesh* mesh = mScene->mMeshes[a];
            if(mesh->mMaterialIndex == (unsigned int)iIndex && mappings[0] == aiTextureMapping_UV)
            {
                if (!mesh->mTextureCoords[0])
                {
                    // This is a special case ... it could be that the
                    // original mesh format intended the use of a special
                    // mapping here.
                    ReportWarning("UV-mapped texture, but there are no UV coords");
                }
            }
        }
    }
}